

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O0

void __thiscall Fossilize::VulkanDevice::~VulkanDevice(VulkanDevice *this)

{
  bool bVar1;
  reference ppVVar2;
  VkSamplerYcbcrConversion_T **ycbcr;
  iterator __end1;
  iterator __begin1;
  vector<VkSamplerYcbcrConversion_T_*,_std::allocator<VkSamplerYcbcrConversion_T_*>_> *__range1;
  VulkanDevice *this_local;
  
  (this->super_DeviceQueryInterface)._vptr_DeviceQueryInterface =
       (_func_int **)&PTR__VulkanDevice_004e7f40;
  __end1 = std::vector<VkSamplerYcbcrConversion_T_*,_std::allocator<VkSamplerYcbcrConversion_T_*>_>
           ::begin(&this->ycbcr_conversions);
  ycbcr = (VkSamplerYcbcrConversion_T **)
          std::vector<VkSamplerYcbcrConversion_T_*,_std::allocator<VkSamplerYcbcrConversion_T_*>_>::
          end(&this->ycbcr_conversions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<VkSamplerYcbcrConversion_T_**,_std::vector<VkSamplerYcbcrConversion_T_*,_std::allocator<VkSamplerYcbcrConversion_T_*>_>_>
                                *)&ycbcr);
    if (!bVar1) break;
    ppVVar2 = __gnu_cxx::
              __normal_iterator<VkSamplerYcbcrConversion_T_**,_std::vector<VkSamplerYcbcrConversion_T_*,_std::allocator<VkSamplerYcbcrConversion_T_*>_>_>
              ::operator*(&__end1);
    (*vkDestroySamplerYcbcrConversionKHR)(this->device,*ppVVar2,(VkAllocationCallbacks *)0x0);
    __gnu_cxx::
    __normal_iterator<VkSamplerYcbcrConversion_T_**,_std::vector<VkSamplerYcbcrConversion_T_*,_std::allocator<VkSamplerYcbcrConversion_T_*>_>_>
    ::operator++(&__end1);
  }
  if (((this->is_null_device & 1U) == 0) && (this->device != (VkDevice)0x0)) {
    (*vkDestroyDevice)(this->device,(VkAllocationCallbacks *)0x0);
  }
  if (this->callback != (VkDebugReportCallbackEXT)0x0) {
    (*vkDestroyDebugReportCallbackEXT)(this->instance,this->callback,(VkAllocationCallbacks *)0x0);
  }
  if (this->instance != (VkInstance)0x0) {
    (*vkDestroyInstance)(this->instance,(VkAllocationCallbacks *)0x0);
  }
  std::vector<VkSamplerYcbcrConversion_T_*,_std::allocator<VkSamplerYcbcrConversion_T_*>_>::~vector
            (&this->ycbcr_conversions);
  FeatureFilter::~FeatureFilter(&this->feature_filter);
  DeviceQueryInterface::~DeviceQueryInterface(&this->super_DeviceQueryInterface);
  return;
}

Assistant:

VulkanDevice::~VulkanDevice()
{
	for (auto &ycbcr : ycbcr_conversions)
		vkDestroySamplerYcbcrConversionKHR(device, ycbcr, nullptr);
	if (!is_null_device && device)
		vkDestroyDevice(device, nullptr);
	if (callback)
		vkDestroyDebugReportCallbackEXT(instance, callback, nullptr);
	if (instance)
		vkDestroyInstance(instance, nullptr);
}